

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O2

int run_test_udp_bind_reuseaddr(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_b_1 = (int64_t)iVar1;
  h2.data = (void *)0x0;
  h1.data = (void *)eval_b_1;
  if ((void *)eval_b_1 == (void *)0x0) {
    loop = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_udp_init(loop,&h1);
    eval_b_1 = (int64_t)iVar1;
    h2.data = (void *)eval_b_1;
    if ((void *)eval_b_1 == (void *)0x0) {
      iVar1 = uv_udp_init(loop,&h2);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b_1 == (void *)0x0) {
        iVar1 = uv_udp_bind(&h1,&addr,4);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          iVar1 = uv_udp_bind(&h2,&addr,4);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b_1 == (void *)0x0) {
            uv_close(&h1,0);
            uv_close(&h2,0);
            iVar1 = uv_run(loop,0);
            eval_b_1 = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b_1 == (void *)0x0) {
              close_loop(loop);
              eval_b_1 = 0;
              iVar1 = uv_loop_close(loop);
              eval_b_2 = (int64_t)iVar1;
              if (eval_b_2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "uv_loop_close(loop)";
              pcVar2 = "0";
              uVar4 = 0x5b;
            }
            else {
              pcVar3 = "0";
              pcVar2 = "r";
              uVar4 = 0x59;
            }
          }
          else {
            pcVar3 = "0";
            pcVar2 = "r";
            uVar4 = 0x53;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "r";
          uVar4 = 0x50;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "r";
        uVar4 = 0x4d;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "r";
      uVar4 = 0x4a;
      eval_b_2 = 0;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar4 = 0x45;
    eval_b_2 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-bind.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_b_1,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(udp_bind_reuseaddr) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT_OK(r);

  r = uv_udp_init(loop, &h2);
  ASSERT_OK(r);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, UV_UDP_REUSEADDR);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}